

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

int __thiscall QtMWidgets::PageControlPrivate::findButton(PageControlPrivate *this,QPoint *pos)

{
  char cVar1;
  reference pQVar2;
  int i;
  long i_00;
  
  i_00 = 0;
  while( true ) {
    if (this->count <= i_00) {
      return -1;
    }
    pQVar2 = QList<QRect>::operator[](&this->rectangles,i_00);
    cVar1 = QRect::contains((QPoint *)pQVar2,SUB81(pos,0));
    if (cVar1 != '\0') break;
    i_00 = i_00 + 1;
  }
  return (int)i_00;
}

Assistant:

int
PageControlPrivate::findButton( const QPoint & pos )
{
	for( int i = 0; i < count; ++i )
	{
		if( rectangles[ i ].contains( pos ) )
			return i;
	}

	return -1;
}